

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::base_internal::StrError_abi_cxx11_
          (string *__return_storage_ptr__,base_internal *this,int errnum)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int errnum_00;
  int extraout_EDX_02;
  ErrnoSaver local_18;
  uint local_14;
  ErrnoSaver errno_saver;
  int errnum_local;
  
  local_14 = (uint)this;
  _errno_saver = __return_storage_ptr__;
  ErrnoSaver::ErrnoSaver(&local_18);
  errnum_00 = extraout_EDX;
  if (StrError[abi:cxx11](int)::table_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&StrError[abi:cxx11](int)::table_abi_cxx11_);
    errnum_00 = extraout_EDX_00;
    if (iVar1 != 0) {
      StrError[abi:cxx11](int)::table_abi_cxx11_ =
           (anonymous_namespace)::NewStrErrorTable_abi_cxx11_();
      __cxa_guard_release(&StrError[abi:cxx11](int)::table_abi_cxx11_);
      errnum_00 = extraout_EDX_01;
    }
  }
  if (-1 < (int)local_14) {
    uVar2 = (ulong)(int)local_14;
    sVar3 = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
            ::size(StrError[abi:cxx11](int)::table_abi_cxx11_);
    errnum_00 = extraout_EDX_02;
    if (uVar2 < sVar3) {
      pvVar4 = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_135UL>
               ::operator[](StrError[abi:cxx11](int)::table_abi_cxx11_,(long)(int)local_14);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar4);
      goto LAB_00566d19;
    }
  }
  (anonymous_namespace)::StrErrorInternal_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)local_14,errnum_00);
LAB_00566d19:
  ErrnoSaver::~ErrnoSaver(&local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  absl::base_internal::ErrnoSaver errno_saver;
  static const auto* table = NewStrErrorTable();
  if (errnum >= 0 && static_cast<size_t>(errnum) < table->size()) {
    return (*table)[static_cast<size_t>(errnum)];
  }
  return StrErrorInternal(errnum);
}